

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O1

SchnorrSignature *
cfd::core::SignCommon
          (SchnorrSignature *__return_storage_ptr__,ByteData256 *msg,Privkey *sk,
          secp256k1_nonce_function_hardened *nonce_fn,ByteData *ndata)

{
  _Alloc_hider msg32;
  pointer sig64;
  SchnorrSignature *pSVar1;
  int iVar2;
  secp256k1_context_struct *ctx;
  uchar *sig64_00;
  CfdException *pCVar3;
  secp256k1_nonce_function_hardened p_Var4;
  value_type_conflict *__val;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> raw_sig;
  secp256k1_schnorrsig_extraparams extra_params;
  secp256k1_keypair keypair;
  string local_108;
  ByteData local_e8;
  secp256k1_schnorrsig_extraparams local_c8;
  SchnorrSignature *local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  secp256k1_keypair local_90;
  
  local_b0 = __return_storage_ptr__;
  ctx = wally_get_secp_context();
  Privkey::GetData(&local_e8,sk);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108,&local_e8);
  iVar2 = secp256k1_keypair_create(ctx,&local_90,(uchar *)local_108._M_dataplus._M_p);
  if ((uchar *)local_108._M_dataplus._M_p != (uchar *)0x0) {
    operator_delete(local_108._M_dataplus._M_p,
                    local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
  }
  if (local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (iVar2 != 1) {
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"Could not create keypair.","");
    CfdException::CfdException(pCVar3,kCfdInternalError,&local_108);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (nonce_fn == (secp256k1_nonce_function_hardened *)0x0) {
    p_Var4 = (secp256k1_nonce_function_hardened)0x0;
  }
  else {
    p_Var4 = *nonce_fn;
  }
  local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sig64_00 = (uchar *)operator_new(0x40);
  local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = sig64_00 + 0x40;
  sig64_00[0x30] = '\0';
  sig64_00[0x31] = '\0';
  sig64_00[0x32] = '\0';
  sig64_00[0x33] = '\0';
  sig64_00[0x34] = '\0';
  sig64_00[0x35] = '\0';
  sig64_00[0x36] = '\0';
  sig64_00[0x37] = '\0';
  sig64_00[0x38] = '\0';
  sig64_00[0x39] = '\0';
  sig64_00[0x3a] = '\0';
  sig64_00[0x3b] = '\0';
  sig64_00[0x3c] = '\0';
  sig64_00[0x3d] = '\0';
  sig64_00[0x3e] = '\0';
  sig64_00[0x3f] = '\0';
  sig64_00[0x20] = '\0';
  sig64_00[0x21] = '\0';
  sig64_00[0x22] = '\0';
  sig64_00[0x23] = '\0';
  sig64_00[0x24] = '\0';
  sig64_00[0x25] = '\0';
  sig64_00[0x26] = '\0';
  sig64_00[0x27] = '\0';
  sig64_00[0x28] = '\0';
  sig64_00[0x29] = '\0';
  sig64_00[0x2a] = '\0';
  sig64_00[0x2b] = '\0';
  sig64_00[0x2c] = '\0';
  sig64_00[0x2d] = '\0';
  sig64_00[0x2e] = '\0';
  sig64_00[0x2f] = '\0';
  sig64_00[0x10] = '\0';
  sig64_00[0x11] = '\0';
  sig64_00[0x12] = '\0';
  sig64_00[0x13] = '\0';
  sig64_00[0x14] = '\0';
  sig64_00[0x15] = '\0';
  sig64_00[0x16] = '\0';
  sig64_00[0x17] = '\0';
  sig64_00[0x18] = '\0';
  sig64_00[0x19] = '\0';
  sig64_00[0x1a] = '\0';
  sig64_00[0x1b] = '\0';
  sig64_00[0x1c] = '\0';
  sig64_00[0x1d] = '\0';
  sig64_00[0x1e] = '\0';
  sig64_00[0x1f] = '\0';
  sig64_00[0] = '\0';
  sig64_00[1] = '\0';
  sig64_00[2] = '\0';
  sig64_00[3] = '\0';
  sig64_00[4] = '\0';
  sig64_00[5] = '\0';
  sig64_00[6] = '\0';
  sig64_00[7] = '\0';
  sig64_00[8] = '\0';
  sig64_00[9] = '\0';
  sig64_00[10] = '\0';
  sig64_00[0xb] = '\0';
  sig64_00[0xc] = '\0';
  sig64_00[0xd] = '\0';
  sig64_00[0xe] = '\0';
  sig64_00[0xf] = '\0';
  local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = sig64_00;
  local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (p_Var4 == (secp256k1_nonce_function_hardened)0x0) {
    ByteData256::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108,msg);
    msg32._M_p = local_108._M_dataplus._M_p;
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8,ndata);
    iVar2 = secp256k1_schnorrsig_sign32
                      (ctx,sig64_00,(uchar *)msg32._M_p,&local_90,
                       (uchar *)CONCAT44(local_c8._4_4_,local_c8.magic));
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)CONCAT44(local_c8._4_4_,local_c8.magic);
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_c8.ndata;
  }
  else {
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108,ndata);
    sig64 = local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start;
    local_c8.magic[0] = 0xda;
    local_c8.magic[1] = 'o';
    local_c8.magic[2] = 0xb3;
    local_c8.magic[3] = 0x8c;
    local_c8.ndata = local_108._M_dataplus._M_p;
    local_c8.noncefp = p_Var4;
    ByteData256::GetBytes(&local_a8,msg);
    iVar2 = secp256k1_schnorrsig_sign_custom
                      (ctx,sig64,
                       local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,0x20,&local_90,&local_c8);
  }
  if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((uchar *)local_108._M_dataplus._M_p != (uchar *)0x0) {
    operator_delete(local_108._M_dataplus._M_p,
                    local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
  }
  if (iVar2 == 1) {
    ByteData::ByteData((ByteData *)&local_108,&local_e8.data_);
    pSVar1 = local_b0;
    SchnorrSignature::SchnorrSignature(local_b0,(ByteData *)&local_108);
    if ((uchar *)local_108._M_dataplus._M_p != (uchar *)0x0) {
      operator_delete(local_108._M_dataplus._M_p,
                      local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
    }
    if (local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_e8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e8.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return pSVar1;
  }
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"Could not create Schnorr signature.","");
  CfdException::CfdException(pCVar3,kCfdInternalError,&local_108);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

SchnorrSignature SignCommon(
    const ByteData256 &msg, const Privkey &sk,
    const secp256k1_nonce_function_hardened *nonce_fn, const ByteData ndata) {
  auto ctx = wally_get_secp_context();
  secp256k1_keypair keypair;
  auto ret =
      secp256k1_keypair_create(ctx, &keypair, sk.GetData().GetBytes().data());

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not create keypair.");
  }

  secp256k1_nonce_function_hardened nfn =
      nonce_fn == nullptr ? nullptr : *nonce_fn;

  std::vector<uint8_t> raw_sig(SchnorrSignature::kSchnorrSignatureSize);

  if (nfn == nullptr) {
    ret = secp256k1_schnorrsig_sign32(
        ctx, raw_sig.data(), msg.GetBytes().data(), &keypair,
        ndata.GetBytes().data());
  } else {
    std::vector<uint8_t> data = ndata.GetBytes();
    secp256k1_schnorrsig_extraparams extra_params = {
        SECP256K1_SCHNORRSIG_EXTRAPARAMS_MAGIC,
        nfn,
        data.data(),
    };
    ret = secp256k1_schnorrsig_sign_custom(
        ctx, raw_sig.data(), msg.GetBytes().data(), kByteData256Length,
        &keypair, &extra_params);
  }

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not create Schnorr signature.");
  }

  return SchnorrSignature(raw_sig);
}